

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.hpp
# Opt level: O2

uint __thiscall
rc::detail::BitStream<rc::Random>::next<unsigned_int>(BitStream<rc::Random> *this,uint nbits)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = 0x20;
  if ((int)nbits < 0x20) {
    uVar7 = nbits;
  }
  if (nbits == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    for (uVar6 = uVar7; 0 < (int)uVar6; uVar6 = uVar6 - uVar2) {
      uVar4 = this->m_numBits;
      if (uVar4 == 0) {
        uVar1 = Random::next(&this->m_source);
        this->m_bits = uVar1;
        uVar4 = this->m_numBits + 0x40;
      }
      else {
        uVar1 = this->m_bits;
      }
      uVar2 = uVar4;
      if ((int)uVar6 < (int)uVar4) {
        uVar2 = uVar6;
      }
      uVar5 = ~(uint)(-1L << ((byte)uVar2 & 0x3f));
      if (0x3f < (int)uVar2) {
        uVar5 = 0xffffffff;
      }
      if (uVar2 < 0x40) {
        this->m_bits = uVar1 >> ((byte)uVar2 & 0x3f);
      }
      uVar3 = uVar3 | ((uint)uVar1 & uVar5) << ((char)uVar7 - (char)uVar6 & 0x3fU);
      this->m_numBits = uVar4 - uVar2;
    }
  }
  return uVar3;
}

Assistant:

T BitStream<Source>::next(int nbits, std::false_type) {
  using SourceType = decltype(m_source.next());
  nbits = std::min(nbits, numBits<T>());

  if (nbits == 0) {
    return 0;
  }

  T value = 0;
  int wantBits = nbits;
  while (wantBits > 0) {
    // Out of bits, refill
    if (m_numBits == 0) {
      m_bits = m_source.next();
      m_numBits += numBits<SourceType>();
    }

    const auto n = std::min(m_numBits, wantBits);
    const auto bits = m_bits & bitMask<SourceType>(n);
    value |= (bits << (nbits - wantBits));
    // To avoid right-shifting data beyond the width of the given type (which is
    // undefined behavior, because of course it is) only perform this shift-
    // assignment if we have room.
    if (static_cast<SourceType>(n) <
        static_cast<SourceType>(numBits<SourceType>())) {
      m_bits >>= static_cast<SourceType>(n);
    }
    m_numBits -= n;
    wantBits -= n;
  }

  if (std::is_signed<T>::value) {
    T signBit = static_cast<T>(0x1) << static_cast<T>(nbits - 1);
    if ((value & signBit) != 0) {
      // For signed values, we use the last bit as the sign bit. Since this
      // was 1, mask away by setting all bits above this one to 1 to make it a
      // negative number in 2's complement
      value |= ~bitMask<T>(nbits);
    }
  }

  return value;
}